

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::crate::CrateReader::ReadHalfArray
          (CrateReader *this,bool is_compressed,
          vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *d)

{
  uint8_t uVar1;
  StreamReader *pSVar2;
  uint64_t uVar3;
  bool bVar4;
  half hVar5;
  ostream *poVar6;
  ulong uVar7;
  _Alloc_hider _Var8;
  long lVar9;
  pointer phVar10;
  char *pcVar11;
  size_t nbytes;
  size_t sVar12;
  size_t length;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  uint32_t n;
  uint32_t shapesize;
  ostringstream ss_e;
  pointer local_200;
  string local_1f8;
  uint local_1cc;
  string local_1c8;
  vector<int,_std::allocator<int>_> local_1a8 [4];
  ios_base local_138 [264];
  
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar4 = StreamReader::read4(this->_sr,(uint32_t *)&local_1c8);
    if (bVar4) {
      bVar4 = StreamReader::read4(this->_sr,&local_1cc);
      if (bVar4) {
        phVar10 = (pointer)(ulong)local_1cc;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadHalfArray",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1ac);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Failed to read the number of array elements.",0x2c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
        phVar10 = local_200;
      }
      goto LAB_001a4485;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadHalfArray",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1a7);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar11 = "Failed to read the number of array elements.";
    lVar9 = 0x2c;
LAB_001a46e0:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,lVar9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p == &local_1f8.field_2) goto LAB_001a473e;
  }
  else {
    bVar4 = StreamReader::read8(this->_sr,(uint64_t *)local_1a8);
    phVar10 = (pointer)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
    if (!bVar4) {
      ::std::__cxx11::string::append((char *)&this->_err);
      phVar10 = local_200;
    }
LAB_001a4485:
    local_200 = phVar10;
    if (bVar4 == false) {
      return false;
    }
    if (local_200 <= (pointer)(this->_config).maxArrayElements) {
      uVar7 = (long)local_200 * 2 + this->_memoryUsage;
      this->_memoryUsage = uVar7;
      if (uVar7 <= (this->_config).maxMemoryBudget) {
        ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::resize
                  (d,(size_type)local_200);
        if (is_compressed) {
          if (local_200 < (pointer)0x10) {
            pSVar2 = this->_sr;
            uVar3 = pSVar2->idx_;
            uVar7 = (long)local_200 * 2;
            sVar12 = pSVar2->length_ - uVar3;
            if (uVar3 + (long)local_200 * 2 <= pSVar2->length_) {
              sVar12 = uVar7;
            }
            bVar4 = sVar12 - 1 < uVar7;
            if (bVar4) {
              memcpy((d->
                     super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                     )._M_impl.super__Vector_impl_data._M_start,pSVar2->binary_ + uVar3,sVar12);
              pSVar2->idx_ = pSVar2->idx_ + sVar12;
            }
            bVar4 = bVar4 && sVar12 != 0;
            if (bVar4) {
              return bVar4;
            }
          }
          else {
            pSVar2 = this->_sr;
            uVar7 = pSVar2->idx_ + 1;
            if (uVar7 <= pSVar2->length_) {
              uVar1 = pSVar2->binary_[pSVar2->idx_];
              pSVar2->idx_ = uVar7;
              if (uVar1 == 't') {
                bVar4 = StreamReader::read4(pSVar2,(uint32_t *)&local_1c8);
                if (bVar4) {
                  local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (int *)0x0;
                  local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                  resize((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                         local_1a8,(ulong)local_1c8._M_dataplus._M_p & 0xffffffff);
                  pSVar2 = this->_sr;
                  uVar3 = pSVar2->idx_;
                  uVar7 = ((ulong)local_1c8._M_dataplus._M_p & 0xffffffff) * 2;
                  sVar12 = pSVar2->length_ - uVar3;
                  if (uVar3 + ((ulong)local_1c8._M_dataplus._M_p & 0xffffffff) * 2 <=
                      pSVar2->length_) {
                    sVar12 = uVar7;
                  }
                  if (sVar12 - 1 < uVar7) {
                    memcpy(local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,pSVar2->binary_ + uVar3,sVar12);
                    pSVar2->idx_ = pSVar2->idx_ + sVar12;
                    if (sVar12 != 0) {
                      local_1f8._M_dataplus._M_p = (pointer)0x0;
                      local_1f8._M_string_length = 0;
                      local_1f8.field_2._M_allocated_capacity = 0;
                      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1f8,
                                 (size_type)local_200);
                      bVar4 = ReadCompressedInts<unsigned_int>
                                        (this,(uint *)local_1f8._M_dataplus._M_p,
                                         (long)(local_1f8._M_string_length -
                                               (long)local_1f8._M_dataplus._M_p) >> 2);
                      if (bVar4) {
                        if (local_1f8._M_dataplus._M_p != (pointer)local_1f8._M_string_length) {
                          phVar10 = (d->
                                    super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                    )._M_impl.super__Vector_impl_data._M_start;
                          _Var8._M_p = local_1f8._M_dataplus._M_p;
                          do {
                            phVar10->value =
                                 *(uint16_t *)
                                  ((long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start +
                                  (ulong)*(uint *)_Var8._M_p * 2);
                            phVar10 = phVar10 + 1;
                            _Var8._M_p = _Var8._M_p + 4;
                          } while (_Var8._M_p != (pointer)local_1f8._M_string_length);
                        }
                      }
                      else {
                        ::std::__cxx11::string::append((char *)&this->_err);
                      }
                      if ((uint *)local_1f8._M_dataplus._M_p != (uint *)0x0) {
                        operator_delete(local_1f8._M_dataplus._M_p,
                                        local_1f8.field_2._M_allocated_capacity -
                                        (long)local_1f8._M_dataplus._M_p);
                      }
                      goto LAB_001a4a3f;
                    }
                  }
                  ::std::__cxx11::string::append((char *)&this->_err);
                  if (local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start == (int *)0x0) {
                    return false;
                  }
                  operator_delete(local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start,
                                  (long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                  return false;
                }
              }
              else if (uVar1 == 'i') {
                local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (int *)0x0;
                local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ::std::vector<int,_std::allocator<int>_>::resize(local_1a8,(size_type)local_200);
                bVar4 = ReadCompressedInts<int>
                                  (this,local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                   (long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 2);
                if (bVar4) {
                  if (local_200 != (pointer)0x0) {
                    phVar10 = (pointer)0x0;
                    do {
                      hVar5 = tinyusdz::value::float_to_half_full
                                        ((float)local_1a8[0].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start
                                                [(long)phVar10]);
                      (d->
                      super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                      )._M_impl.super__Vector_impl_data._M_start[(long)phVar10].value = hVar5.value;
                      phVar10 = (pointer)((long)&phVar10->value + 1);
                    } while (phVar10 < local_200);
                  }
                }
                else {
                  ::std::__cxx11::string::append((char *)&this->_err);
                }
LAB_001a4a3f:
                if (local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (int *)0x0) {
                  operator_delete(local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start,
                                  (long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                if (bVar4 == false) {
                  return false;
                }
                return true;
              }
            }
          }
        }
        else {
          pSVar2 = this->_sr;
          uVar3 = pSVar2->idx_;
          sVar12 = pSVar2->length_ - uVar3;
          if (uVar3 + (long)local_200 * 2 <= pSVar2->length_) {
            sVar12 = (long)local_200 * 2;
          }
          if (sVar12 - 1 < (ulong)((long)local_200 * 2)) {
            memcpy((d->
                   super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                   )._M_impl.super__Vector_impl_data._M_start,pSVar2->binary_ + uVar3,sVar12);
            pSVar2->idx_ = pSVar2->idx_ + sVar12;
            if (sVar12 != 0) {
              return true;
            }
          }
        }
        ::std::__cxx11::string::append((char *)&this->_err);
        return false;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadHalfArray",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1bd);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pcVar11 = "Reached to max memory budget.";
      lVar9 = 0x1d;
      goto LAB_001a46e0;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadHalfArray",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1ba);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c8,"Too many array elements {}.","");
    fmt::format<unsigned_long>(&local_1f8,&local_1c8,(unsigned_long *)&local_200);
    poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p == &local_1f8.field_2) goto LAB_001a473e;
  }
  operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
LAB_001a473e:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool CrateReader::ReadHalfArray(bool is_compressed,
                                std::vector<value::half> *d) {
  size_t length;
  // < ver 0.7.0  use 32bit
  if (VERSION_LESS_THAN_0_8_0(_version)) {
      uint32_t shapesize; // not used
      if (!_sr->read4(&shapesize)) {
        PUSH_ERROR("Failed to read the number of array elements.");
        return false;
      }
    uint32_t n;
    if (!_sr->read4(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    length = size_t(n);
  } else {
    uint64_t n;
    if (!_sr->read8(&n)) {
      _err += "Failed to read the number of array elements.\n";
      return false;
    }

    length = size_t(n);
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Too many array elements {}.", length));
  }

  CHECK_MEMORY_USAGE(length * sizeof(uint16_t));

  d->resize(length);

  if (!is_compressed) {


    // TODO(syoyo): Zero-copy
    if (!_sr->read(sizeof(uint16_t) * length, sizeof(uint16_t) * length,
                   reinterpret_cast<uint8_t *>(d->data()))) {
      _err += "Failed to read half array data.\n";
      return false;
    }

    return true;
  } else {

    //
    // compressed data is represented by integers or look-up table.
    //

    if (length < crate::kMinCompressedArraySize) {
      size_t sz = sizeof(uint16_t) * length;
      // Not stored in compressed.
      // reader.ReadContiguous(odata, osize);
      if (!_sr->read(sz, sz, reinterpret_cast<uint8_t *>(d->data()))) {
        _err += "Failed to read uncompressed array data.\n";
        return false;
      }
      return true;
    }

    // Read the code
    char code;
    if (!_sr->read1(&code)) {
      _err += "Failed to read the code.\n";
      return false;
    }

    if (code == 'i') {
      // Compressed integers.
      std::vector<int32_t> ints;
      ints.resize(length);
      if (!ReadCompressedInts(ints.data(), ints.size())) {
        _err += "Failed to read compressed ints in ReadHalfArray.\n";
        return false;
      }
      for (size_t i = 0; i < length; i++) {
        float f = float(ints[i]);
        value::half h = value::float_to_half_full(f);
        (*d)[i] = h;
      }
    } else if (code == 't') {
      // Lookup table & indexes.
      uint32_t lutSize;
      if (!_sr->read4(&lutSize)) {
        _err += "Failed to read lutSize in ReadHalfArray.\n";
        return false;
      }

      std::vector<value::half> lut;
      lut.resize(lutSize);
      if (!_sr->read(sizeof(value::half) * lutSize, sizeof(value::half) * lutSize,
                     reinterpret_cast<uint8_t *>(lut.data()))) {
        _err += "Failed to read lut table in ReadHalfArray.\n";
        return false;
      }

      std::vector<uint32_t> indexes;
      indexes.resize(length);
      if (!ReadCompressedInts(indexes.data(), indexes.size())) {
        _err += "Failed to read lut indices in ReadHalfArray.\n";
        return false;
      }

      auto o = d->data();
      for (auto index : indexes) {
        *o++ = lut[index];
      }
    } else {
      _err += "Invalid code. Data is currupted\n";
      return false;
    }

    return true;
  }

}